

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

bool __thiscall
mp::BasicSolver::ParseOptions
          (BasicSolver *this,char **argv,uint flags,ASLProblem *param_4,char *additional_options)

{
  long lVar1;
  bool bVar2;
  char *pcVar3;
  size_t sVar4;
  string *psVar5;
  long *plVar6;
  uint in_EDX;
  long *in_RSI;
  char *in_RDI;
  long in_R8;
  char *s_4;
  char *s_3;
  char *s_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ext;
  size_type pt;
  string exe_basename;
  path p;
  char *s;
  bool had_exe_name_option_var;
  char *s_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd8;
  path *in_stack_fffffffffffffde0;
  char *in_stack_fffffffffffffe00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe08;
  allocator<char> *in_stack_fffffffffffffe10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  string local_1d8 [16];
  path *in_stack_fffffffffffffe38;
  string local_1b8 [32];
  char *local_198;
  BasicSolver *in_stack_fffffffffffffe70;
  string local_170 [32];
  char *local_150;
  string local_148 [32];
  string local_128 [32];
  long local_108;
  path local_100;
  string local_e0 [16];
  string *in_stack_ffffffffffffff30;
  allocator<char> local_b9;
  string local_b8 [28];
  uint in_stack_ffffffffffffff64;
  char *in_stack_ffffffffffffff68;
  BasicSolver *in_stack_ffffffffffffff70;
  allocator<char> local_59;
  string local_58 [32];
  char *local_38;
  uint local_1c;
  long *local_18;
  bool local_1;
  
  in_RDI[0x24c] = '\0';
  *(uint *)(in_RDI + 400) = *(uint *)(in_RDI + 400) & 0xfffffffe;
  *(uint *)(in_RDI + 0x194) = in_EDX;
  if (in_R8 == 0) {
    local_1c = in_EDX;
    local_18 = in_RSI;
    local_38 = getenv("mp_options");
    if (local_38 != (char *)0x0) {
      in_stack_fffffffffffffe10 = &local_59;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe20,in_RDI,in_stack_fffffffffffffe10);
      WarnOnDifferentCapitalizations(in_stack_ffffffffffffff30);
      std::__cxx11::string::~string(local_58);
      std::allocator<char>::~allocator(&local_59);
      ParseOptionString(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                        in_stack_ffffffffffffff64);
    }
    bVar2 = false;
    pcVar3 = exe_path((BasicSolver *)0x2c0cbc);
    sVar4 = strlen(pcVar3);
    if (sVar4 != 0) {
      in_stack_fffffffffffffe08 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe20,in_RDI,in_stack_fffffffffffffe10);
      path::path(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
      std::__cxx11::string::~string(local_b8);
      std::allocator<char>::~allocator(&local_b9);
      path::filename(in_stack_fffffffffffffe38);
      psVar5 = path::string_abi_cxx11_(&local_100);
      std::__cxx11::string::string(local_e0,(string *)psVar5);
      path::~path((path *)0x2c0d90);
      local_108 = std::__cxx11::string::rfind((char)local_e0,0x2e);
      in_stack_fffffffffffffe00 = pcVar3;
      if (local_108 != -1) {
        std::__cxx11::string::substr((ulong)local_128,(ulong)local_e0);
        bVar2 = std::operator==((char *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
        if ((bVar2) ||
           (bVar2 = std::operator==((char *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8),
           in_stack_fffffffffffffe00 = pcVar3, bVar2)) {
          std::__cxx11::string::substr((ulong)local_148,(ulong)local_e0);
          std::__cxx11::string::operator=(local_e0,local_148);
          std::__cxx11::string::~string(local_148);
          in_stack_fffffffffffffe00 = pcVar3;
        }
        std::__cxx11::string::~string(local_128);
      }
      std::operator+(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      pcVar3 = getenv(pcVar3);
      std::__cxx11::string::~string(local_170);
      bVar2 = pcVar3 != (char *)0x0;
      local_150 = pcVar3;
      if (bVar2) {
        std::operator+(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
        WarnOnDifferentCapitalizations(in_stack_ffffffffffffff30);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffe70);
        ParseOptionString(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                          in_stack_ffffffffffffff64);
      }
      std::__cxx11::string::~string(local_e0);
      path::~path((path *)0x2c1052);
    }
    if (!bVar2) {
      std::operator+(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      pcVar3 = getenv(pcVar3);
      std::__cxx11::string::~string(local_1b8);
      local_198 = pcVar3;
      if (pcVar3 != (char *)0x0) {
        std::operator+(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
        WarnOnDifferentCapitalizations(in_stack_ffffffffffffff30);
        std::__cxx11::string::~string(local_1d8);
        ParseOptionString(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                          in_stack_ffffffffffffff64);
      }
    }
    local_1c = local_1c | 2;
    if (local_18 != (long *)0x0) {
      while (plVar6 = local_18 + 1, lVar1 = *local_18, local_18 = plVar6, lVar1 != 0) {
        ParseOptionString(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                          in_stack_ffffffffffffff64);
      }
    }
    if ((*(uint *)(in_RDI + 400) & 1) != 0) {
      ShowVersion(in_stack_fffffffffffffe70);
    }
    local_1 = (bool)((in_RDI[0x24c] ^ 0xffU) & 1);
  }
  else {
    ParseOptionString(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64)
    ;
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool BasicSolver::ParseOptions(char **argv, unsigned flags, const ASLProblem *, char* additional_options) {
  has_errors_ = false;
  bool_options_ &= ~SHOW_VERSION;
  option_flag_save_ = flags;
  // 0. If additional options are specified, parse only those
  if (additional_options) {
    ParseOptionString(additional_options, NO_OPTION_ECHO);
    return false;
  }
  
  // 1. Try & parse 'mp_options'
  if (const char *s = std::getenv("mp_options")) {
    WarnOnDifferentCapitalizations("mp_options");
    ParseOptionString(s, flags);
  }
  bool had_exe_name_option_var = false;
  // 2. Try the '<solver_exe>_options' env var.
  const char *s = exe_path();
  if (std::strlen(s)) {
    path p(s);
    auto exe_basename = p.filename().string();
    auto pt = exe_basename.rfind('.');
    if (std::string::npos != pt) {
      auto ext = exe_basename.substr(pt);
      if (".exe"==ext || ".app"==ext)
        exe_basename = exe_basename.substr(0, pt);
    }
    if (const char *s
        = std::getenv((exe_basename + "_options").c_str())) {
      WarnOnDifferentCapitalizations(exe_basename + "_options");
      ParseOptionString(s, flags);
      had_exe_name_option_var = true;
    }
  }
  // 3. If no exe-name-specific options,
  // try '<solver_std_name>_options', such as 'gurobi_options'
  if (!had_exe_name_option_var)
  if (const char *s = std::getenv((name_ + "_options").c_str())) {
    WarnOnDifferentCapitalizations(name_ + "_options");
    ParseOptionString(s, flags);
  }
  // 4. Proceed to command-line options
  flags |= FROM_COMMAND_LINE;
  if (argv) {
    while (const char *s = *argv++) {
      ParseOptionString(s, flags);
    }
  }
  
  if ((bool_options_ & SHOW_VERSION) != 0)
    ShowVersion();
  return !has_errors_;
}